

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

iterator * __thiscall
idx2::Insert<unsigned_long,idx2::brick_volume>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::brick_volume> *Ht,unsigned_long *Key,brick_volume *Val)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  long lVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  
  bVar11 = (byte)*(undefined8 *)(this + 0x20);
  if (7L << (bVar11 & 0x3f) <= *(long *)(this + 0x18) * 10) {
    IncreaseCapacity<unsigned_long,idx2::brick_volume>
              ((hash_table<unsigned_long,_idx2::brick_volume> *)this);
    bVar11 = (byte)*(undefined8 *)(this + 0x20);
  }
  puVar2 = Ht->Keys;
  uVar13 = (ulong)((long)puVar2 * -0x61c8864680b583eb) >> (-bVar11 & 0x3f);
  if (*(char *)(*(long *)(this + 0x10) + uVar13) == '\x02') {
    do {
      if (*(unsigned_long **)(*(long *)this + uVar13 * 8) == puVar2) break;
      uVar13 = uVar13 + 1 & ~(-1L << (bVar11 & 0x3f));
    } while (*(char *)(*(long *)(this + 0x10) + uVar13) == '\x02');
  }
  *(unsigned_long **)(*(long *)this + uVar13 * 8) = puVar2;
  lVar3 = *(long *)(this + 8);
  lVar12 = uVar13 * 0x40;
  uVar4 = *Key;
  uVar5 = Key[1];
  uVar6 = Key[2];
  uVar7 = Key[3];
  uVar8 = *(undefined8 *)((long)Key + 0x24);
  uVar9 = *(undefined8 *)((long)Key + 0x2c);
  uVar10 = *(undefined8 *)((long)Key + 0x34);
  puVar1 = (undefined8 *)(lVar3 + 0x1c + lVar12);
  *puVar1 = *(undefined8 *)((long)Key + 0x1c);
  puVar1[1] = uVar8;
  puVar1[2] = uVar9;
  puVar1[3] = uVar10;
  puVar2 = (unsigned_long *)(lVar3 + lVar12);
  *puVar2 = uVar4;
  puVar2[1] = uVar5;
  puVar2[2] = uVar6;
  puVar2[3] = uVar7;
  if (*(char *)(*(long *)(this + 0x10) + uVar13) != '\x02') {
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    *(undefined1 *)(*(long *)(this + 0x10) + uVar13) = 2;
  }
  __return_storage_ptr__->Key = (unsigned_long *)(uVar13 * 8 + *(long *)this);
  __return_storage_ptr__->Val = (brick_volume *)(lVar12 + *(long *)(this + 8));
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::brick_volume> *)this;
  __return_storage_ptr__->Idx = uVar13;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Insert(hash_table<k, v>* Ht, const k& Key, const v& Val)
{
  if (Size(*Ht) * 10 >= Capacity(*Ht) * 7)
    IncreaseCapacity(Ht);

  i64 H = Index(*Ht, Hash(Key));
  while (Ht->Stats[H] == hash_table<k, v>::Occupied && !(Ht->Keys[H] == Key))
  {
    ++H;
    H &= Capacity(*Ht) - 1;
  }

  Ht->Keys[H] = Key;
  Ht->Vals[H] = Val;
  if (Ht->Stats[H] != hash_table<k, v>::Occupied)
  {
    ++Ht->Size;
    Ht->Stats[H] = hash_table<k, v>::Occupied;
  }

  return IterAt(*Ht, H);
}